

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O1

void Minisat::sort<unsigned_int,reduceDB_tch>(uint *array,int size,reduceDB_tch lt)

{
  ulong uVar1;
  ulong *puVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  uint *puVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint *puVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  long local_80;
  
  while( true ) {
    if (size < 0x10) {
      selectionSort<unsigned_int,reduceDB_tch>(array,size,lt);
      return;
    }
    if (0x20 < size) break;
    uVar16 = array[(uint)size >> 1];
    puVar9 = ((lt.ca)->super_RegionAllocator<unsigned_int>).memory;
    uVar14 = (ulong)(uint)size;
    lVar24 = -1;
    while( true ) {
      uVar3 = *(uint *)((long)puVar9 +
                       (ulong)(puVar9[(ulong)uVar16 + 1] & 0xfffffffc) + (ulong)uVar16 * 4 + 0xc);
      lVar24 = (long)(int)lVar24;
      puVar17 = array + lVar24;
      do {
        lVar24 = lVar24 + 1;
        uVar20 = puVar17[1];
        puVar17 = puVar17 + 1;
      } while (*(uint *)((long)(puVar9 + uVar20) + (*(ulong *)(puVar9 + uVar20) >> 0x22) * 4 + 0xc)
               < uVar3);
      uVar14 = (ulong)(int)uVar14;
      do {
        lVar5 = uVar14 - 1;
        uVar14 = uVar14 - 1;
      } while (uVar3 < *(uint *)((long)(puVar9 + array[lVar5]) +
                                (*(ulong *)(puVar9 + array[lVar5]) >> 0x22) * 4 + 0xc));
      if ((long)uVar14 <= lVar24) break;
      *puVar17 = array[lVar5];
      array[uVar14] = uVar20;
    }
    sort<unsigned_int,reduceDB_tch>(array,(int)lVar24,lt);
    size = size - (int)lVar24;
    array = puVar17;
  }
  uVar14 = (ulong)(uint)size;
  puVar9 = (uint *)operator_new__(uVar14 * 4);
  uVar16 = 1;
  bVar6 = false;
  do {
    bVar7 = bVar6;
    puVar17 = array;
    array = puVar9;
    uVar3 = uVar16 * 2;
    lVar24 = (long)(int)uVar16;
    uVar19 = 0;
    uVar20 = uVar3;
    local_80 = lVar24;
    do {
      uVar21 = uVar20;
      if ((long)uVar14 < (long)(int)uVar20) {
        uVar21 = size;
      }
      uVar1 = uVar19 + (long)(int)uVar3;
      uVar10 = (uint)uVar1;
      if (size < (int)(uint)uVar1) {
        uVar10 = size;
      }
      uVar11 = lVar24 + uVar19;
      uVar23 = (uint)uVar11;
      uVar4 = uVar16 + uVar23;
      if (size <= (int)(uVar16 + uVar23)) {
        uVar4 = size;
      }
      uVar8 = (uint)uVar19;
      uVar13 = uVar8;
      if ((0 < (int)uVar16) && ((long)uVar11 < (long)(int)uVar4)) {
        puVar9 = ((lt.ca)->super_RegionAllocator<unsigned_int>).memory;
        uVar25 = uVar11 & 0xffffffff;
        uVar15 = uVar19 & 0xffffffff;
        do {
          iVar12 = (int)uVar15;
          puVar2 = (ulong *)(puVar9 + puVar17[iVar12]);
          uVar23 = *(uint *)((long)puVar2 + (*puVar2 >> 0x22) * 4 + 0xc);
          puVar2 = (ulong *)(puVar9 + puVar17[(int)uVar25]);
          uVar18 = *(uint *)((long)puVar2 + (*puVar2 >> 0x22) * 4 + 0xc);
          uVar13 = iVar12 + (uint)(uVar23 < uVar18);
          uVar15 = (ulong)uVar13;
          uVar22 = puVar17[(int)uVar25];
          if (uVar23 < uVar18) {
            uVar22 = puVar17[iVar12];
          }
          uVar23 = ((int)uVar25 + 1) - (uint)(uVar23 < uVar18);
          uVar25 = (ulong)uVar23;
          array[uVar19] = uVar22;
          uVar19 = uVar19 + 1;
        } while (((long)(int)uVar13 < (long)uVar11) && ((int)uVar23 < (int)uVar4));
      }
      uVar18 = (uint)uVar19;
      if ((long)(int)uVar13 < (long)uVar11) {
        memcpy(array + (int)uVar18,puVar17 + (int)uVar13,
               (ulong)((uVar8 + (uVar16 - 1)) - uVar13) * 4 + 4);
        uVar18 = (uVar18 + (int)local_80) - uVar13;
      }
      if ((int)uVar23 < (int)uVar4) {
        memcpy(array + (int)uVar18,puVar17 + (int)uVar23,(ulong)(uVar10 + ~uVar23) * 4 + 4);
        uVar18 = (uVar21 + uVar18) - uVar23;
      }
      local_80 = local_80 + (int)uVar3;
      uVar20 = uVar20 + uVar3;
      uVar19 = uVar1;
    } while ((long)uVar1 < (long)(uVar14 - lVar24));
    if ((int)uVar18 < size) {
      memcpy(array + (int)uVar18,puVar17 + (int)uVar18,(ulong)(~uVar18 + size) * 4 + 4);
    }
    puVar9 = puVar17;
    uVar16 = uVar3;
    bVar6 = (bool)(bVar7 ^ 1);
  } while ((int)uVar3 < size);
  if (!bVar7) {
    memcpy(puVar17,array,uVar14 * 4);
    puVar17 = array;
  }
  if (puVar17 == (uint *)0x0) {
    return;
  }
  operator_delete__(puVar17);
  return;
}

Assistant:

void sort(T *array, int size, LessThan lt)
{
    if (size <= 15) {
        selectionSort(array, size, lt);
    } else if (size > 32) {
        mergesort(array, size, lt);
    } else {
        T pivot = array[size / 2];
        T tmp;
        int i = -1;
        int j = size;

        for (;;) {
            do
                i++;
            while (lt(array[i], pivot));
            do
                j--;
            while (lt(pivot, array[j]));

            if (i >= j) break;

            tmp = array[i];
            array[i] = array[j];
            array[j] = tmp;
        }

        sort(array, i, lt);
        sort(&array[i], size - i, lt);
    }
}